

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::_::PromiseBase>::~ExceptionOr(ExceptionOr<kj::_::PromiseBase> *this)

{
  ExceptionOr<kj::_::PromiseBase> *this_local;
  
  Maybe<kj::_::PromiseBase>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr() = default;